

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall
deqp::gls::DrawTest::addIteration(DrawTest *this,DrawTestSpec *spec,char *description)

{
  pointer pDVar1;
  bool bVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar2 = DrawTestSpec::valid(spec);
  if ((bVar2) &&
     ((pDVar1 = (this->m_specs).
                super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pDVar1 == (this->m_specs).
                super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish ||
      ((pDVar1->apiType).m_bits == (spec->apiType).m_bits)))) {
    std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::push_back
              (&this->m_specs,spec);
    if (description == (char *)0x0) {
      local_38._M_string_length = 0;
      local_38.field_2._M_local_buf[0] = '\0';
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_iteration_descriptions,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      sVar3 = strlen(description);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,description,description + sVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_iteration_descriptions,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
    }
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void DrawTest::addIteration (const DrawTestSpec& spec, const char* description)
{
	// Validate spec
	const bool validSpec = spec.valid();
	DE_ASSERT(validSpec);

	if (!validSpec)
		return;

	// Check the context type is the same with other iterations
	if (!m_specs.empty())
	{
		const bool validContext = m_specs[0].apiType == spec.apiType;
		DE_ASSERT(validContext);

		if (!validContext)
			return;
	}

	m_specs.push_back(spec);

	if (description)
		m_iteration_descriptions.push_back(std::string(description));
	else
		m_iteration_descriptions.push_back(std::string());
}